

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O2

coda_mem_array * coda_mem_array_new(coda_type_array *definition,coda_dynamic_type *attributes)

{
  long lVar1;
  int iVar2;
  coda_mem_array *type;
  coda_dynamic_type **ppcVar3;
  long lVar4;
  
  if (definition == (coda_type_array *)0x0) {
    coda_set_error(-100,"definition argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x24b);
    return (coda_mem_array *)0x0;
  }
  type = (coda_mem_array *)malloc(0x30);
  if (type == (coda_mem_array *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x30,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x252);
    return (coda_mem_array *)0x0;
  }
  type->backend = coda_backend_memory;
  type->definition = definition;
  definition->retain_count = definition->retain_count + 1;
  type->tag = tag_mem_array;
  type->attributes = attributes;
  type->num_elements = 0;
  type->element = (coda_dynamic_type **)0x0;
  if (attributes == (coda_dynamic_type *)0x0) {
    iVar2 = create_attributes_record((coda_mem_type *)type);
    if (iVar2 != 0) goto LAB_0015cbb9;
    definition = type->definition;
  }
  lVar1 = definition->num_elements;
  if (lVar1 < 1) {
    return type;
  }
  ppcVar3 = (coda_dynamic_type **)malloc(lVar1 * 8);
  type->element = ppcVar3;
  if (ppcVar3 != (coda_dynamic_type **)0x0) {
    type->num_elements = lVar1;
    for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
      type->element[lVar4] = (coda_dynamic_type *)0x0;
    }
    return type;
  }
  coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",lVar1 * 8,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                 ,0x26d);
LAB_0015cbb9:
  coda_mem_type_delete((coda_dynamic_type *)type);
  return (coda_mem_array *)0x0;
}

Assistant:

coda_mem_array *coda_mem_array_new(coda_type_array *definition, coda_dynamic_type *attributes)
{
    coda_mem_array *type;

    if (definition == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition argument is NULL (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    type = (coda_mem_array *)malloc(sizeof(coda_mem_array));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_mem_array), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_memory;
    type->definition = definition;
    definition->retain_count++;
    type->tag = tag_mem_array;
    type->attributes = attributes;
    type->num_elements = 0;
    type->element = NULL;

    if (attributes == NULL)
    {
        if (create_attributes_record((coda_mem_type *)type) != 0)
        {
            coda_mem_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
    }
    if (type->definition->num_elements > 0)
    {
        long i;

        type->element = malloc(type->definition->num_elements * sizeof(coda_dynamic_type *));
        if (type->element == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           type->definition->num_elements * sizeof(coda_dynamic_type *), __FILE__, __LINE__);
            coda_mem_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        type->num_elements = type->definition->num_elements;
        for (i = 0; i < type->num_elements; i++)
        {
            type->element[i] = NULL;
        }
    }

    return type;
}